

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

bool __thiscall QHttp2ProtocolHandler::sendRequest(QHttp2ProtocolHandler *this)

{
  _Base_ptr *message;
  byte bVar1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  QHttp2Stream *pQVar6;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *request;
  QNonContiguousByteDevice *pQVar7;
  char *pcVar8;
  QHttpNetworkConnectionChannel *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_60;
  QHttp2Stream *stream;
  QUrl promiseKey;
  qsizetype qVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *(byte *)(*(long *)(this + 0x38) + 0x2a9);
  if (bVar1 == 1) {
    QHttpNetworkConnectionChannel::emitFinishedWithError
              (*(QHttpNetworkConnectionChannel **)(this + 0x18),ProtocolUnknownError,
               "GOAWAY received, cannot start a request");
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
               (*(long *)(this + 0x18) + 0x80));
  }
  else {
    this_00 = *(QHttpNetworkConnectionChannel **)(this + 0x18) + 0x80;
    iVar4._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                   ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00)
    ;
    iVar5 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                      ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                       this_00);
    while ((iterator)iVar4._M_node != iVar5.i._M_node) {
      bVar3 = QHttpNetworkRequest::isPreConnect((QHttpNetworkRequest *)&iVar4._M_node[1]._M_parent);
      if (bVar3) {
        QHttpNetworkConnection::preConnectFinished(*(QHttpNetworkConnection **)(this + 0x30));
        QHttpNetworkReply::finished((QHttpNetworkReply *)iVar4._M_node[1]._M_right);
        iVar4._M_node =
             (_Base_ptr)
             QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                       ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                        this_00,iVar4._M_node);
        if ((*(long *)this_00 == 0) || (*(long *)(*(long *)this_00 + 0x30) == 0)) goto LAB_001e0875;
      }
      else {
        iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
      }
    }
    if ((*(long *)this_00 != 0) && (*(long *)(*(long *)this_00 + 0x30) != 0)) {
      *(undefined4 *)(*(long *)(this + 0x18) + 0x20) = 2;
      iVar4._M_node =
           (_Base_ptr)
           QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                     ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                      this_00);
      iVar5 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                        ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                         this_00);
      goto LAB_001e0956;
    }
  }
LAB_001e0875:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 ^ 1);
LAB_001e0956:
  if ((iterator)iVar4._M_node == iVar5.i._M_node) goto LAB_001e0a8b;
  message = &iVar4._M_node[1]._M_parent;
  promiseKey.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_6cb099::urlkey_from_request
            ((anon_unknown_dwarf_6cb099 *)&promiseKey,(QHttpNetworkRequest *)message);
  pQVar6 = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),&promiseKey);
  if (pQVar6 == (QHttp2Stream *)0x0) {
    stream = createNewStream(this,(HttpMessagePair *)message,false);
    if (stream == (QHttp2Stream *)0x0) {
      bVar3 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)iVar4._M_node[1]._M_right);
      if (bVar3) {
        QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                  ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00,
                   (const_iterator)iVar4._M_node);
      }
      QUrl::~QUrl(&promiseKey);
      goto LAB_001e0a8b;
    }
    request = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
              operator[]((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                          *)(this + 0x50),&stream);
    bVar3 = sendHEADERS(this,stream,&request->first);
    if (bVar3) {
      pQVar7 = QHttpNetworkRequest::uploadByteDevice(&request->first);
      if ((pQVar7 == (QNonContiguousByteDevice *)0x0) ||
         (bVar3 = sendDATA((QHttp2ProtocolHandler *)request,stream,
                           (QHttpNetworkReply *)iVar4._M_node[1]._M_right), bVar3))
      goto LAB_001e099f;
      qVar9 = 0x1c;
      pcVar8 = "failed to send DATA frame(s)";
    }
    else {
      qVar9 = 0x1f;
      pcVar8 = "failed to send HEADERS frame(s)";
    }
    pQVar6 = stream;
    latin1.m_data = pcVar8;
    latin1.m_size = qVar9;
    QString::QString((QString *)&local_60,latin1);
    finishStreamWithError(this,pQVar6,UnknownNetworkError,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  else {
    initReplyFromPushPromise(this,(HttpMessagePair *)message,&promiseKey);
LAB_001e099f:
    iVar4._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                   ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00,
                    iVar4._M_node);
  }
  QUrl::~QUrl(&promiseKey);
  goto LAB_001e0956;
LAB_001e0a8b:
  *(undefined4 *)(*(long *)(this + 0x18) + 0x20) = 0;
  goto LAB_001e0875;
}

Assistant:

bool QHttp2ProtocolHandler::sendRequest()
{
    if (h2Connection->isGoingAway()) {
        // Stop further calls to this method: we have received GOAWAY
        // so we cannot create new streams.
        m_channel->emitFinishedWithError(QNetworkReply::ProtocolUnknownError,
                                         "GOAWAY received, cannot start a request");
        m_channel->h2RequestsToSend.clear();
        return false;
    }

    // Process 'fake' (created by QNetworkAccessManager::connectToHostEncrypted())
    // requests first:
    auto &requests = m_channel->h2RequestsToSend;
    for (auto it = requests.begin(), endIt = requests.end(); it != endIt;) {
        const auto &pair = *it;
        if (pair.first.isPreConnect()) {
            m_connection->preConnectFinished();
            emit pair.second->finished();
            it = requests.erase(it);
            if (requests.empty()) {
                // Normally, after a connection was established and H2
                // was negotiated, we send a client preface. connectToHostEncrypted
                // though is not meant to send any data, it's just a 'preconnect'.
                // Thus we return early:
                return true;
            }
        } else {
            ++it;
        }
    }

    if (requests.empty())
        return true;

    m_channel->state = QHttpNetworkConnectionChannel::WritingState;
    // Check what was promised/pushed, maybe we do not have to send a request
    // and have a response already?

    for (auto it = requests.begin(), end = requests.end(); it != end;) {
        HttpMessagePair &httpPair = *it;

        QUrl promiseKey = urlkey_from_request(httpPair.first);
        if (h2Connection->promisedStream(promiseKey) != nullptr) {
            // There's a PUSH_PROMISE for this request, so we don't send one
            initReplyFromPushPromise(httpPair, promiseKey);
            it = requests.erase(it);
            continue;
        }

        QHttp2Stream *stream = createNewStream(httpPair);
        if (!stream) { // There was an issue creating the stream
            // Check if it was unrecoverable, ie. the reply is errored out and finished:
            if (httpPair.second->isFinished()) {
                it = requests.erase(it);
            }
            // ... either way we stop looping:
            break;
        }

        QHttpNetworkRequest &request = requestReplyPairs[stream].first;
        if (!sendHEADERS(stream, request)) {
            finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                    "failed to send HEADERS frame(s)"_L1);
            continue;
        }
        if (request.uploadByteDevice()) {
            if (!sendDATA(stream, httpPair.second)) {
                finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                                      "failed to send DATA frame(s)"_L1);
                continue;
            }
        }
        it = requests.erase(it);
    }

    m_channel->state = QHttpNetworkConnectionChannel::IdleState;

    return true;
}